

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.hpp
# Opt level: O2

void __thiscall
boost::xpressive::detail::
dynamic_xpression<boost::xpressive::detail::assert_word_matcher<boost::xpressive::detail::word_end,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::dynamic_xpression(dynamic_xpression<boost::xpressive::detail::assert_word_matcher<boost::xpressive::detail::word_end,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *this,assert_word_matcher<boost::xpressive::detail::word_end,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
                          *matcher)

{
  matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pmVar1;
  shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar2;
  
  *(char_class_type *)
   &(this->
    super_matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ).field_0xc = matcher->word_;
  (this->
  super_matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ).
  super_counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .count_.value_ = 0;
  (this->
  super_matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ).
  super_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._vptr_matchable = (_func_int **)&PTR__dynamic_xpression_00187980;
  psVar2 = get_invalid_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>();
  pmVar1 = (psVar2->xpr_).px;
  (this->next_).xpr_.px = pmVar1;
  if (pmVar1 != (matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)0x0) {
    LOCK();
    (pmVar1->
    super_counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ).count_.value_ =
         (pmVar1->
         super_counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ).count_.value_ + 1;
    UNLOCK();
  }
  return;
}

Assistant:

dynamic_xpression(Matcher const &matcher = Matcher())
      : Matcher(matcher)
      , next_(get_invalid_xpression<BidiIter>())
    {
    }